

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O3

bool Imf_3_4::areCounterparts(string *channel1,string *channel2,StringVector *multiView)

{
  pointer pcVar1;
  size_t sVar2;
  pointer pbVar3;
  pointer pbVar4;
  int iVar5;
  char c;
  char c_00;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  StringVector chan1;
  StringVector chan2;
  StringVector local_e0;
  StringVector local_c8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (channel1->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + channel1->_M_string_length);
  anon_unknown_5::parseString(&local_e0,&local_50,c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pbVar3 = local_e0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (channel2->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + channel2->_M_string_length);
  anon_unknown_5::parseString(&local_c8,&local_90,c_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pbVar4 = local_c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)local_c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (local_e0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar3 && lVar6 != 0) {
    lVar7 = (long)local_e0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3;
    uVar8 = lVar7 >> 5;
    if (((uVar8 < 2) ||
        (iVar5 = anon_unknown_5::viewNum
                           (*(string **)
                             ((long)local_e0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0x40),
                            *(StringVector **)
                             ((long)local_e0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar7 + -0x38)),
        iVar5 != -1)) &&
       ((uVar9 = lVar6 >> 5, uVar9 < 2 ||
        (iVar5 = anon_unknown_5::viewNum
                           (*(string **)((long)pbVar4 + lVar6 + -0x40),
                            *(StringVector **)((long)pbVar4 + lVar6 + -0x38)), iVar5 != -1)))) {
      viewFromChannelName(&local_b0,channel1,multiView);
      viewFromChannelName(&local_70,channel2,multiView);
      if (local_b0._M_string_length == local_70._M_string_length) {
        if (local_b0._M_string_length == 0) {
          bVar10 = true;
        }
        else {
          iVar5 = bcmp(local_b0._M_dataplus._M_p,local_70._M_dataplus._M_p,local_b0._M_string_length
                      );
          bVar10 = iVar5 == 0;
        }
      }
      else {
        bVar10 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar10) {
        pbVar3 = local_c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = local_e0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((lVar7 == 0x20) ||
           (bVar10 = lVar6 == 0x20,
           pbVar3 = local_e0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
           pbVar4 = local_c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, lVar6 = lVar7, bVar10)) {
          if ((lVar6 == 0x40) &&
             (sVar2 = pbVar4->_M_string_length, sVar2 == pbVar3[1]._M_string_length)) {
            if (sVar2 == 0) {
              bVar10 = true;
            }
            else {
              iVar5 = bcmp((pbVar4->_M_dataplus)._M_p,pbVar3[1]._M_dataplus._M_p,sVar2);
              bVar10 = iVar5 == 0;
            }
            goto LAB_001926f2;
          }
        }
        else if (uVar8 == uVar9) {
          lVar6 = 8;
          uVar9 = 0;
          do {
            if ((uVar8 - 2 != uVar9) &&
               ((sVar2 = *(size_t *)
                          ((long)&((local_e0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar6),
                sVar2 != *(size_t *)
                          ((long)&((local_c8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar6) ||
                ((sVar2 != 0 &&
                 (iVar5 = bcmp(*(void **)((long)local_e0.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                         lVar6 + -8),
                               *(void **)((long)local_c8.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                         lVar6 + -8),sVar2), iVar5 != 0)))))) goto LAB_001926f0;
            uVar9 = uVar9 + 1;
            lVar6 = lVar6 + 0x20;
          } while (uVar8 + (uVar8 == 0) != uVar9);
          bVar10 = uVar8 <= uVar9;
          goto LAB_001926f2;
        }
      }
    }
  }
LAB_001926f0:
  bVar10 = false;
LAB_001926f2:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0);
  return bVar10;
}

Assistant:

bool
areCounterparts (
    const string&       channel1,
    const string&       channel2,
    const StringVector& multiView)
{
    //
    // Given two channels, return true if they are the same
    // channel in two different views.
    //

    StringVector chan1 = parseString (channel1);
    size_t       size1 = chan1.size (); // number of SECTIONS in string
                                        // name (not string length)

    StringVector chan2 = parseString (channel2);
    size_t       size2 = chan2.size ();

    if (size1 == 0 || size2 == 0) return false;

    //
    // channel1 and channel2 can't be counterparts
    // if either channel is in no view.
    //

    if (size1 > 1 && viewNum (chan1[size1 - 2], multiView) == -1) return false;

    if (size2 > 1 && viewNum (chan2[size2 - 2], multiView) == -1) return false;

    if (viewFromChannelName (channel1, multiView) ==
        viewFromChannelName (channel2, multiView))
    {
        //
        // channel1 and channel2 are not counterparts
        // if they are in the same view.
        //

        return false;
    }

    if (size1 == 1)
    {
        //
        // channel1 is a default channel - the channels will only be
        // counterparts if channel2 is of the form <view>.<channel1>
        //

        return size2 == 2 && chan1[0] == chan2[1];
    }

    if (size2 == 1)
    {
        //
        // channel2 is a default channel - the channels will only be
        // counterparts if channel1 is of the form <view>.<channel2>
        //

        return size1 == 2 && chan2[0] == chan1[1];
    }

    //
    // Neither channel is a default channel.  To be counterparts both
    // channel names must have the same number of components, and
    // all components except the penultimate one must be the same.
    //

    if (size1 != size2) return false;

    for (size_t i = 0; i < size1; ++i)
    {
        if (i != size1 - 2 && chan1[i] != chan2[i]) return false;
    }

    return true;
}